

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ptr<log_entry> __thiscall nuraft::inmem_log_store::entry_at(inmem_log_store *this,ulong index)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ptr<log_entry> pVar2;
  iterator entry;
  lock_guard<std::mutex> l;
  ptr<log_entry> src;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_stack_ffffffffffffff68;
  shared_ptr<nuraft::log_entry> *in_stack_ffffffffffffff70;
  _Self local_50;
  _Self local_48 [2];
  ptr<log_entry> *in_stack_ffffffffffffffc8;
  shared_ptr<nuraft::log_entry> local_28 [2];
  
  std::shared_ptr<nuraft::log_entry>::shared_ptr
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,
             (mutex_type *)in_stack_ffffffffffffff68);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x1a3f92);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator==(local_48,&local_50);
  if (bVar1) {
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
         ::find(in_stack_ffffffffffffff68,(key_type *)0x1a3fe7);
  }
  std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>::
  operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>
              *)0x1a4038);
  std::shared_ptr<nuraft::log_entry>::operator=
            (local_28,(shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff68);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a4058);
  make_clone(in_stack_ffffffffffffffc8);
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1a4073);
  pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<log_entry>)pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<log_entry> inmem_log_store::entry_at(ulong index) {
    ptr<log_entry> src = nullptr;
    {   std::lock_guard<std::mutex> l(logs_lock_);
        auto entry = logs_.find(index);
        if (entry == logs_.end()) {
            entry = logs_.find(0);
        }
        src = entry->second;
    }
    return make_clone(src);
}